

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool SearchBoundedPlaneXYZHelper
               (ON_RTreeNode *a_node,double *a_bounded_plane,ON_RTreeSearchResultCallback *a_result)

{
  int iVar1;
  bool bVar2;
  ON_RTreeBranch *branch;
  int count;
  int i;
  ON_RTreeSearchResultCallback *a_result_local;
  double *a_bounded_plane_local;
  ON_RTreeNode *a_node_local;
  
  iVar1 = a_node->m_count;
  if (0 < iVar1) {
    bVar2 = ON_RTreeNode::IsInternalNode(a_node);
    if (bVar2) {
      for (branch._4_4_ = 0; branch._4_4_ < iVar1; branch._4_4_ = branch._4_4_ + 1) {
        bVar2 = OverlapBoundedPlaneXYZHelper(a_bounded_plane,&a_node->m_branch[branch._4_4_].m_rect)
        ;
        if ((bVar2) &&
           (bVar2 = SearchBoundedPlaneXYZHelper
                              (a_node->m_branch[branch._4_4_].field_1.m_child,a_bounded_plane,
                               a_result), !bVar2)) {
          return false;
        }
      }
    }
    else {
      for (branch._4_4_ = 0; branch._4_4_ < iVar1; branch._4_4_ = branch._4_4_ + 1) {
        bVar2 = OverlapBoundedPlaneXYZHelper(a_bounded_plane,&a_node->m_branch[branch._4_4_].m_rect)
        ;
        if ((bVar2) &&
           (bVar2 = (*a_result->m_resultCallback)
                              (a_result->m_context,
                               (ON__INT_PTR)a_node->m_branch[branch._4_4_].field_1.m_child), !bVar2)
           ) {
          return false;
        }
      }
    }
  }
  return true;
}

Assistant:

static
bool SearchBoundedPlaneXYZHelper(const ON_RTreeNode* a_node, const double* a_bounded_plane, ON_RTreeSearchResultCallback& a_result ) 
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapBoundedPlaneXYZHelper(a_bounded_plane, &branch[i].m_rect))
        {
          if(!SearchBoundedPlaneXYZHelper(branch[i].m_child, a_bounded_plane, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapBoundedPlaneXYZHelper(a_bounded_plane, &branch[i].m_rect))
        {
          if ( !a_result.m_resultCallback( a_result.m_context, branch[i].m_id ) )
          {
            // callback canceled search
            return false;
          }
        }
      }
    }
  }

  return true; // Continue searching
}